

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_append_vector(flatcc_builder_t *B,void *data,size_t count)

{
  int iVar1;
  void *pvVar2;
  
  if (B->frame->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3a8,
                  "void *flatcc_builder_append_vector(flatcc_builder_t *, const void *, size_t)");
  }
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,(B->frame->container).vector.max_count);
  if (iVar1 != 0) {
    return (void *)0x0;
  }
  pvVar2 = push_ds_copy(B,data,(flatbuffers_uoffset_t)count * (B->frame->container).table.vs_end);
  return pvVar2;
}

Assistant:

void *flatcc_builder_append_vector(flatcc_builder_t *B, const void *data, size_t count)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds_copy(B, data, frame(container.vector.elem_size) * (uoffset_t)count);
}